

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

BranchInstr * __thiscall
Lowerer::GenerateFastBrConst(Lowerer *this,BranchInstr *branchInstr,Opnd *constOpnd,bool isEqual)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  RegOpnd *pRVar4;
  BranchInstr *pBVar5;
  char *this_00;
  
  bVar2 = IR::Opnd::IsAddrOpnd(constOpnd);
  if (!bVar2) {
    bVar2 = IR::Opnd::IsIntConstOpnd(constOpnd);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0xd1b,"(constOpnd->IsAddrOpnd() || constOpnd->IsIntConstOpnd())",
                         "constOpnd->IsAddrOpnd() || constOpnd->IsIntConstOpnd()");
      if (!bVar2) goto LAB_005635fb;
      *puVar3 = 0;
    }
  }
  this_00 = (char *)(branchInstr->super_Instr).m_src2;
  pRVar4 = IR::Opnd::AsRegOpnd((Opnd *)this_00);
  bVar2 = IsConstRegOpnd((Lowerer *)this_00,pRVar4);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    this_00 = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
    ;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0xd28,"(IsConstRegOpnd(branchInstr->GetSrc2()->AsRegOpnd()))",
                       "IsConstRegOpnd(branchInstr->GetSrc2()->AsRegOpnd())");
    if (!bVar2) {
LAB_005635fb:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  pRVar4 = GetRegOpnd((Lowerer *)this_00,(branchInstr->super_Instr).m_src1,&branchInstr->super_Instr
                      ,this->m_func,TyVar);
  pBVar5 = InsertCompareBranch((Lowerer *)this_00,&pRVar4->super_Opnd,constOpnd,isEqual ^ BrNeq_A,
                               branchInstr->m_branchTarget,&branchInstr->super_Instr,false);
  return pBVar5;
}

Assistant:

IR::BranchInstr *
Lowerer::GenerateFastBrConst(IR::BranchInstr *branchInstr, IR::Opnd * constOpnd, bool isEqual)
{
    Assert(constOpnd->IsAddrOpnd() || constOpnd->IsIntConstOpnd());

    //
    // Given:
    // BrSrXx_A $L1, s1, s2
    // where s2 is either 'null', 'undefined', 'true' or 'false'
    //
    // Generate:
    //
    // CMP s1, s2
    // JEQ/JNE $L1
    //

    Assert(IsConstRegOpnd(branchInstr->GetSrc2()->AsRegOpnd()));

    IR::RegOpnd *opnd = GetRegOpnd(branchInstr->GetSrc1(), branchInstr, m_func, TyVar);

    IR::BranchInstr *newBranch;
    newBranch = InsertCompareBranch(opnd, constOpnd, isEqual ? Js::OpCode::BrEq_A : Js::OpCode::BrNeq_A, branchInstr->GetTarget(), branchInstr);

    return newBranch;
}